

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt32emu-smf2wav.cpp
# Opt level: O2

void putSampleLE(void *sampleBuffer,int sampleIx,FILE *outputFile,
                OUTPUT_SAMPLE_FORMAT outputSampleFormat)

{
  ushort uVar1;
  Bit32u BVar2;
  uint __c;
  
  if (outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
    BVar2 = makeIeeeFloat(*(float *)((long)sampleBuffer + (long)sampleIx * 4));
    fputc(BVar2 & 0xff,(FILE *)outputFile);
    fputc(BVar2 >> 8 & 0xff,(FILE *)outputFile);
    fputc(BVar2 >> 0x10 & 0xff,(FILE *)outputFile);
    __c = BVar2 >> 0x18;
  }
  else {
    uVar1 = *(ushort *)((long)sampleBuffer + (long)sampleIx * 2);
    fputc((uint)(byte)uVar1,(FILE *)outputFile);
    __c = (uint)(uVar1 >> 8);
  }
  fputc(__c,(FILE *)outputFile);
  return;
}

Assistant:

static inline void putSampleLE(void * const sampleBuffer, const int sampleIx, FILE *outputFile, const OUTPUT_SAMPLE_FORMAT outputSampleFormat) {
	if (outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
		MT32Emu::Bit32u sample = makeIeeeFloat(static_cast<float *>(sampleBuffer)[sampleIx]);
		fputc(sample & 0xFF, outputFile);
		fputc((sample >> 8) & 0xFF, outputFile);
		fputc((sample >> 16) & 0xFF, outputFile);
		fputc((sample >> 24) & 0xFF, outputFile);
	} else {
		MT32Emu::Bit16s sample = static_cast<MT32Emu::Bit16s *>(sampleBuffer)[sampleIx];
		fputc(sample & 0xFF, outputFile);
		fputc((sample >> 8) & 0xFF, outputFile);
	}
}